

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

void __thiscall lsim::Simulator::node_set_initial_value(Simulator *this,node_t node_id,Value value)

{
  timestamp_t tVar1;
  ulong uVar2;
  
  uVar2 = (ulong)node_id;
  if (uVar2 < (ulong)(((long)(this->m_node_metadata).
                             super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_node_metadata).
                            super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x88)) {
    (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl
    .super__Vector_impl_data._M_start[uVar2] = value;
    (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar2] = value;
    tVar1 = this->m_time;
    (this->m_node_write_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar2] = tVar1;
    (this->m_node_change_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar2] = tVar1;
    return;
  }
  __assert_fail("node_id < m_node_metadata.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xd0,"void lsim::Simulator::node_set_initial_value(node_t, Value)");
}

Assistant:

void Simulator::node_set_initial_value(node_t node_id, Value value) {
    assert(node_id < m_node_metadata.size());
    m_node_values_read[node_id] = value;
    m_node_values_write[node_id] = value;
    m_node_write_time[node_id] = m_time;
    m_node_change_time[node_id] = m_time;
}